

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void us_internal_socket_context_link(us_socket_context_t *context,us_socket_t *s)

{
  us_socket_t *s_local;
  us_socket_context_t *context_local;
  
  s->context = context;
  s->timeout = 0;
  s->next = context->head;
  s->prev = (us_socket_t *)0x0;
  if (context->head != (us_socket_t *)0x0) {
    context->head->prev = s;
  }
  context->head = s;
  return;
}

Assistant:

void us_internal_socket_context_link(struct us_socket_context_t *context, struct us_socket_t *s) {
    s->context = context;
    s->timeout = 0;
    s->next = context->head;
    s->prev = 0;
    if (context->head) {
        context->head->prev = s;
    }
    context->head = s;
}